

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

void Adam7_deinterlace(uchar *out,uchar *in,uint w,uint h,uint bpp)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  uchar bit_00;
  ulong uVar7;
  size_t sStack_178;
  uchar bit;
  size_t ibp;
  size_t obp;
  int local_160;
  uint olinebits;
  uint ilinebits;
  uint b_1;
  uint y_1;
  uint x_1;
  size_t pixeloutstart;
  size_t pixelinstart;
  size_t bytewidth;
  uint b;
  uint y;
  uint x;
  uint i;
  size_t passstart [8];
  size_t padded_passstart [8];
  size_t filter_passstart [8];
  uint passh [7];
  uint passw [7];
  uint bpp_local;
  uint h_local;
  uint w_local;
  uchar *in_local;
  uchar *out_local;
  
  Adam7_getpassvalues(passh + 6,(uint *)(filter_passstart + 7),padded_passstart + 7,passstart + 7,
                      (size_t *)&x,w,h,bpp);
  if (bpp < 8) {
    for (y = 0; y != 7; y = y + 1) {
      local_160 = bpp * passh[(ulong)y + 6];
      obp._4_4_ = bpp * w;
      for (ilinebits = 0; ilinebits < passh[(ulong)y - 2]; ilinebits = ilinebits + 1) {
        for (b_1 = 0; b_1 < passh[(ulong)y + 6]; b_1 = b_1 + 1) {
          sStack_178 = *(long *)(&x + (ulong)y * 2) * 8 + (ulong)(ilinebits * local_160 + b_1 * bpp)
          ;
          ibp = (size_t)((ADAM7_IY[y] + ilinebits * ADAM7_DY[y]) * obp._4_4_ +
                        (ADAM7_IX[y] + b_1 * ADAM7_DX[y]) * bpp);
          for (olinebits = 0; olinebits < bpp; olinebits = olinebits + 1) {
            bit_00 = readBitFromReversedStream(&stack0xfffffffffffffe88,in);
            setBitOfReversedStream0(&ibp,out,bit_00);
          }
        }
      }
    }
  }
  else {
    for (y = 0; y != 7; y = y + 1) {
      uVar7 = (ulong)(bpp >> 3);
      for (bytewidth._4_4_ = 0; bytewidth._4_4_ < passh[(ulong)y - 2];
          bytewidth._4_4_ = bytewidth._4_4_ + 1) {
        for (b = 0; b < passh[(ulong)y + 6]; b = b + 1) {
          lVar6 = *(long *)(&x + (ulong)y * 2);
          uVar1 = passh[(ulong)y + 6];
          uVar2 = ADAM7_IY[y];
          uVar3 = ADAM7_DY[y];
          uVar4 = ADAM7_IX[y];
          uVar5 = ADAM7_DX[y];
          for (bytewidth._0_4_ = 0; (uint)bytewidth < uVar7; bytewidth._0_4_ = (uint)bytewidth + 1)
          {
            out[((uVar2 + bytewidth._4_4_ * uVar3) * w + uVar4 + b * uVar5) * uVar7 +
                (ulong)(uint)bytewidth] =
                 in[lVar6 + (bytewidth._4_4_ * uVar1 + b) * uVar7 + (ulong)(uint)bytewidth];
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void Adam7_deinterlace(unsigned char* out, const unsigned char* in, unsigned w, unsigned h, unsigned bpp)
{
  unsigned passw[7], passh[7];
  size_t filter_passstart[8], padded_passstart[8], passstart[8];
  unsigned i;

  Adam7_getpassvalues(passw, passh, filter_passstart, padded_passstart, passstart, w, h, bpp);

  if(bpp >= 8)
  {
    for(i = 0; i != 7; ++i)
    {
      unsigned x, y, b;
      size_t bytewidth = bpp / 8;
      for(y = 0; y < passh[i]; ++y)
      for(x = 0; x < passw[i]; ++x)
      {
        size_t pixelinstart = passstart[i] + (y * passw[i] + x) * bytewidth;
        size_t pixeloutstart = ((ADAM7_IY[i] + y * ADAM7_DY[i]) * w + ADAM7_IX[i] + x * ADAM7_DX[i]) * bytewidth;
        for(b = 0; b < bytewidth; ++b)
        {
          out[pixeloutstart + b] = in[pixelinstart + b];
        }
      }
    }
  }
  else /*bpp < 8: Adam7 with pixels < 8 bit is a bit trickier: with bit pointers*/
  {
    for(i = 0; i != 7; ++i)
    {
      unsigned x, y, b;
      unsigned ilinebits = bpp * passw[i];
      unsigned olinebits = bpp * w;
      size_t obp, ibp; /*bit pointers (for out and in buffer)*/
      for(y = 0; y < passh[i]; ++y)
      for(x = 0; x < passw[i]; ++x)
      {
        ibp = (8 * passstart[i]) + (y * ilinebits + x * bpp);
        obp = (ADAM7_IY[i] + y * ADAM7_DY[i]) * olinebits + (ADAM7_IX[i] + x * ADAM7_DX[i]) * bpp;
        for(b = 0; b < bpp; ++b)
        {
          unsigned char bit = readBitFromReversedStream(&ibp, in);
          /*note that this function assumes the out buffer is completely 0, use setBitOfReversedStream otherwise*/
          setBitOfReversedStream0(&obp, out, bit);
        }
      }
    }
  }
}